

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiBufferViewCreateTests.cpp
# Opt level: O3

TestCaseGroup * vkt::api::createBufferViewCreateTests(TestContext *testCtx)

{
  TestNode *pTVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  ostringstream testDescription;
  ostringstream testName;
  long *local_390;
  long local_388;
  long local_380;
  long lStack_378;
  TestNode *local_370;
  long *local_368 [2];
  long local_358 [2];
  long *local_348;
  long local_338 [2];
  TestContext *local_328;
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_370 = (TestNode *)operator_new(0x70);
  local_328 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_370,testCtx,"create","BufferView Construction Tests");
  lVar4 = 1;
  do {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__cxx11::ostringstream::ostringstream(local_320);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"create_buffer_view_",0x13);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"vkBufferView test ",0x12);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,(char *)local_390,local_388);
    if (local_390 != &local_380) {
      operator_delete(local_390,local_380 + 1);
    }
    pTVar1 = (TestNode *)operator_new(0x90);
    std::__cxx11::stringbuf::str();
    plVar2 = (long *)std::__cxx11::string::append((char *)local_368);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_380 = *plVar3;
      lStack_378 = plVar2[3];
      local_390 = &local_380;
    }
    else {
      local_380 = *plVar3;
      local_390 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::stringbuf::str();
    tcu::TestCase::TestCase((TestCase *)pTVar1,local_328,(char *)local_390,(char *)local_348);
    pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cef710;
    *(int *)&pTVar1[1]._vptr_TestNode = (int)lVar4;
    pTVar1[1].m_testCtx = (TestContext *)0x0;
    pTVar1[1].m_name._M_dataplus._M_p = (pointer)0xffffffffffffffff;
    pTVar1[1].m_name._M_string_length = 0x800000004;
    tcu::TestNode::addChild(local_370,pTVar1);
    if (local_348 != local_338) {
      operator_delete(local_348,local_338[0] + 1);
    }
    if (local_390 != &local_380) {
      operator_delete(local_390,local_380 + 1);
    }
    if (local_368[0] != local_358) {
      operator_delete(local_368[0],local_358[0] + 1);
    }
    pTVar1 = (TestNode *)operator_new(0x90);
    std::__cxx11::stringbuf::str();
    plVar2 = (long *)std::__cxx11::string::append((char *)local_368);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_380 = *plVar3;
      lStack_378 = plVar2[3];
      local_390 = &local_380;
    }
    else {
      local_380 = *plVar3;
      local_390 = (long *)*plVar2;
    }
    local_388 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::stringbuf::str();
    tcu::TestCase::TestCase((TestCase *)pTVar1,local_328,(char *)local_390,(char *)local_348);
    pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cef710;
    *(int *)&pTVar1[1]._vptr_TestNode = (int)lVar4;
    pTVar1[1].m_testCtx = (TestContext *)0x0;
    pTVar1[1].m_name._M_dataplus._M_p = (pointer)0xffffffffffffffff;
    pTVar1[1].m_name._M_string_length = 0x1000000008;
    tcu::TestNode::addChild(local_370,pTVar1);
    if (local_348 != local_338) {
      operator_delete(local_348,local_338[0] + 1);
    }
    if (local_390 != &local_380) {
      operator_delete(local_390,local_380 + 1);
    }
    if (local_368[0] != local_358) {
      operator_delete(local_368[0],local_358[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_320);
    std::ios_base::~ios_base(local_2b0);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    std::ios_base::~ios_base(local_138);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xb9);
  return (TestCaseGroup *)local_370;
}

Assistant:

tcu::TestCaseGroup* createBufferViewCreateTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>	bufferViewTests	(new tcu::TestCaseGroup(testCtx, "create", "BufferView Construction Tests"));

	const VkDeviceSize range = VK_WHOLE_SIZE;
	for (deUint32 format = VK_FORMAT_UNDEFINED + 1; format < VK_CORE_FORMAT_LAST; format++)
	{
		std::ostringstream	testName;
		std::ostringstream	testDescription;
		testName << "create_buffer_view_" << format;
		testDescription << "vkBufferView test " << testName.str();
		{
			BufferViewCaseParameters testParams	=
			{
				(VkFormat)format,							// VkFormat				format;
				0,											// VkDeviceSize			offset;
				range,										// VkDeviceSize			range;
				VK_BUFFER_USAGE_UNIFORM_TEXEL_BUFFER_BIT,	// VkBufferUsageFlags	usage;
				VK_FORMAT_FEATURE_UNIFORM_TEXEL_BUFFER_BIT, // VkFormatFeatureFlags flags;
			};
			bufferViewTests->addChild(new BufferViewTestCase(testCtx, testName.str() + "_uniform", testDescription.str(), testParams));
		}
		{
			BufferViewCaseParameters testParams	=
			{
				(VkFormat)format,							// VkFormat				format;
				0,											// VkDeviceSize			offset;
				range,										// VkDeviceSize			range;
				VK_BUFFER_USAGE_STORAGE_TEXEL_BUFFER_BIT,	// VkBufferUsageFlags	usage;
				VK_FORMAT_FEATURE_STORAGE_TEXEL_BUFFER_BIT, // VkFormatFeatureFlags flags;
			};
			bufferViewTests->addChild(new BufferViewTestCase(testCtx, testName.str() + "_storage", testDescription.str(), testParams));
		}
	}

	return bufferViewTests.release();
}